

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

double get_frame_importance(TplParams *tpl_data,int gf_frame_index)

{
  int iVar1;
  int iVar2;
  TplDepFrame *pTVar3;
  TplDepStats *pTVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  double dStack_40;
  
  pTVar3 = tpl_data->tpl_frame;
  iVar15 = 1 << (tpl_data->tpl_stats_block_mis_log2 & 0x1f);
  if (pTVar3[gf_frame_index].mi_rows < 1) {
    dVar16 = 0.0;
  }
  else {
    pTVar4 = pTVar3[gf_frame_index].tpl_stats_ptr;
    iVar1 = pTVar3[gf_frame_index].stride;
    dVar11 = 0.0;
    dStack_40 = 0.0;
    iVar12 = 0;
    dVar16 = 1.0;
    do {
      if (0 < pTVar3[gf_frame_index].mi_cols) {
        iVar14 = 0;
        do {
          auVar9._8_4_ = SUB84(dStack_40,0);
          auVar9._0_8_ = dVar11;
          auVar9._12_4_ = (int)((ulong)dStack_40 >> 0x20);
          iVar13 = (iVar14 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) +
                   (iVar12 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) * iVar1;
          dVar10 = (double)pTVar4[iVar13].srcrf_dist;
          iVar2 = pTVar3[gf_frame_index].base_rdmult;
          lVar5 = pTVar4[iVar13].mc_dep_rate;
          lVar6 = pTVar4[iVar13].mc_dep_dist;
          dVar7 = (double)(pTVar4[iVar13].recrf_dist << 7);
          if (dVar7 <= 1.0) {
            dVar7 = 1.0;
          }
          dVar8 = log(dVar7);
          dVar7 = log((double)(lVar6 * 0x80 + (iVar2 * lVar5 + 0x100 >> 9)) + dVar7);
          dStack_40 = auVar9._8_8_;
          dVar16 = dVar16 + dVar10;
          dVar11 = dVar11 + dVar10 * dVar7;
          dStack_40 = dStack_40 + dVar10 * dVar8;
          iVar14 = iVar14 + iVar15;
        } while (iVar14 < pTVar3[gf_frame_index].mi_cols);
      }
      iVar12 = iVar12 + iVar15;
    } while (iVar12 < pTVar3[gf_frame_index].mi_rows);
    dVar16 = (dVar11 - dStack_40) / dVar16;
  }
  dVar16 = exp(dVar16);
  return dVar16;
}

Assistant:

static double get_frame_importance(const TplParams *tpl_data,
                                   int gf_frame_index) {
  const TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_frame_index];
  const TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 1;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      const int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      dist_scaled = AOMMAX(dist_scaled, 1);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }
  return exp((mc_dep_cost_base - intra_cost_base) / cbcmp_base);
}